

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

BroadcastInfo * parseBroadcastInfo(BroadcastInfo *__return_storage_ptr__,string *message)

{
  byte bVar1;
  pointer pcVar2;
  char cVar3;
  string local_30;
  
  (__return_storage_ptr__->ip)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->ip).field_2;
  (__return_storage_ptr__->ip)._M_string_length = 0;
  (__return_storage_ptr__->ip).field_2._M_local_buf[0] = '\0';
  pcVar2 = (message->_M_dataplus)._M_p;
  std::__cxx11::to_string(&local_30,(uint)(byte)pcVar2[3]);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  cVar3 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar3);
  std::__cxx11::to_string(&local_30,(uint)(byte)pcVar2[4]);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::push_back(cVar3);
  std::__cxx11::to_string(&local_30,(uint)(byte)pcVar2[5]);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::push_back(cVar3);
  std::__cxx11::to_string(&local_30,(uint)(byte)pcVar2[6]);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  bVar1 = pcVar2[7];
  __return_storage_ptr__->port = (uint)bVar1 << 8;
  __return_storage_ptr__->port = (uint)CONCAT11(bVar1,pcVar2[8]);
  bVar1 = pcVar2[9];
  __return_storage_ptr__->key = (uint)bVar1 << 8;
  __return_storage_ptr__->key = (uint)CONCAT11(bVar1,pcVar2[10]);
  return __return_storage_ptr__;
}

Assistant:

BroadcastInfo parseBroadcastInfo(const std::string & message) {
    BroadcastInfo result;

    const uint8_t *p = (uint8_t *) message.data();
    p += strlen(kFileBroadcastPrefix);

    result.ip += std::to_string((uint8_t)(*p++));
    result.ip += '.';
    result.ip += std::to_string((uint8_t)(*p++));
    result.ip += '.';
    result.ip += std::to_string((uint8_t)(*p++));
    result.ip += '.';
    result.ip += std::to_string((uint8_t)(*p++));

    result.port  = 256*((int)(*p++));
    result.port +=     ((int)(*p++));

    result.key  = 256*((int)(*p++));
    result.key +=     ((int)(*p++));

    return result;
}